

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCasts.hpp
# Opt level: O2

DOMParentNode * xercesc_4_0::castToParentImpl(DOMNode *p)

{
  long *plVar1;
  long lVar2;
  DOMParentNode *pDVar3;
  DOMException *this;
  
  if (p != (DOMNode *)0x0) {
    plVar1 = (long *)__dynamic_cast(p,&DOMNode::typeinfo,&HasDOMParentImpl::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar1 != (long *)0x0) {
      lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
      if (lVar2 != 0) {
        pDVar3 = (DOMParentNode *)(**(code **)(*plVar1 + 0x18))(plVar1);
        return pDVar3;
      }
    }
  }
  this = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

static inline const DOMParentNode *castToParentImpl(const DOMNode *p) {
    const HasDOMParentImpl *pE = dynamic_cast<const HasDOMParentImpl*>(p);
    if (!pE || !pE->getParentNodeImpl()) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, XMLPlatformUtils::fgMemoryManager);
    }
    return pE->getParentNodeImpl();
}